

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,int8_t *value,int8_t *defval)

{
  int32_t vv;
  int32_t vvd;
  int local_20;
  int local_1c;
  
  local_20 = (int)*value;
  if (defval == (int8_t *)0x0) {
    local_1c = local_20 + -1;
  }
  else {
    local_1c = (int)*defval;
  }
  Serialize(arc,key,&local_20,&local_1c);
  *value = (int8_t)local_20;
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, int8_t &value, int8_t *defval)
{
	int32_t vv = value;
	int32_t vvd = defval? *defval : value-1;
	Serialize(arc, key, vv, &vvd);
	value = (int8_t)vv;
	return arc;
}